

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

bool __thiscall fasttext::Dictionary::readWord(Dictionary *this,istream *in,string *word)

{
  long *plVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  
  plVar1 = *(long **)(in + *(long *)(*(long *)in + -0x18) + 0xe8);
  word->_M_string_length = 0;
  *(word->_M_dataplus)._M_p = '\0';
LAB_00111946:
  do {
    pbVar2 = (byte *)plVar1[2];
    if (pbVar2 < (byte *)plVar1[3]) {
      uVar3 = (uint)*pbVar2;
      plVar1[2] = (long)(pbVar2 + 1);
    }
    else {
      uVar3 = (**(code **)(*plVar1 + 0x50))(plVar1);
    }
    iVar4 = uVar3 * 0x1000000;
    if (iVar4 == -0x1000000) {
      std::istream::get();
      return word->_M_string_length != 0;
    }
    if ((uVar3 & 0xfb) != 9) {
      if (iVar4 < 0xb000000) {
        if ((iVar4 != 0) && (iVar4 != 0xa000000)) goto LAB_001119b3;
      }
      else if ((iVar4 != 0xb000000) && ((iVar4 != 0x20000000 && (iVar4 != 0xc000000)))) {
LAB_001119b3:
        std::__cxx11::string::push_back((char)word);
        goto LAB_00111946;
      }
    }
    if (word->_M_string_length != 0) {
      if (iVar4 != 0xa000000) {
        return true;
      }
      if ((ulong)plVar1[1] < (ulong)plVar1[2]) {
        plVar1[2] = plVar1[2] - 1;
        return true;
      }
      readWord();
      return true;
    }
    if (iVar4 == 0xa000000) {
      std::__cxx11::string::_M_append((char *)word,EOS_abi_cxx11_);
      return true;
    }
  } while( true );
}

Assistant:

bool Dictionary::readWord(std::istream& in, std::string& word) const
{
  char c;
  std::streambuf& sb = *in.rdbuf();
  word.clear();
  while ((c = sb.sbumpc()) != EOF) {
    if (c == ' ' || c == '\n' || c == '\r' || c == '\t' || c == '\v' || c == '\f' || c == '\0') {
      if (word.empty()) {
        if (c == '\n') {
          word += EOS;
          return true;
        }
        continue;
      } else {
        if (c == '\n')
          sb.sungetc();
        return true;
      }
    }
    word.push_back(c);
  }
  // trigger eofbit
  in.get();
  return !word.empty();
}